

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bumpers.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool local_229;
  byte local_220;
  byte local_21f;
  byte local_21e;
  byte local_21d;
  byte local_21c;
  byte local_21b;
  byte local_21a;
  byte local_219;
  bool contact_bumpers [2];
  bool light_bumpers [6];
  uint16_t light_signals [6];
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  undefined8 uStack_38;
  RobotModel model;
  char **argv_local;
  int argc_local;
  
  uStack_38 = create::RobotModel::CREATE_2;
  _model = _Init;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_229 = false;
  if (1 < argc) {
    pcVar3 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    local_229 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_229 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    uStack_38 = create::RobotModel::CREATE_1;
    _model = _operator<<;
    local_70 = 0xe100;
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    create::Create::~Create(local_1e8);
    std::__cxx11::string::~string(local_58);
    return 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  create::Create::setMode((CreateMode *)local_1e8);
  memset(contact_bumpers,0,0xc);
  memset(&local_21e,0,6);
  memset(&local_220,0,2);
  do {
    bVar1 = create::RobotModel::operator==
                      ((RobotModel *)&uStack_38,(RobotModel *)&create::RobotModel::CREATE_2);
    if ((bVar1 & 1) != 0) {
      contact_bumpers = (bool  [2])create::Create::getLightSignalLeft();
      light_bumpers._0_2_ = create::Create::getLightSignalFrontLeft();
      light_bumpers._2_2_ = create::Create::getLightSignalCenterLeft();
      light_bumpers._4_2_ = create::Create::getLightSignalCenterRight();
      light_signals[0] = create::Create::getLightSignalFrontRight();
      light_signals[1] = create::Create::getLightSignalRight();
      local_21e = create::Create::isLightBumperLeft();
      local_21e = local_21e & 1;
      local_21d = create::Create::isLightBumperFrontLeft();
      local_21d = local_21d & 1;
      local_21c = create::Create::isLightBumperCenterLeft();
      local_21c = local_21c & 1;
      local_21b = create::Create::isLightBumperCenterRight();
      local_21b = local_21b & 1;
      local_21a = create::Create::isLightBumperFrontRight();
      local_21a = local_21a & 1;
      local_219 = create::Create::isLightBumperRight();
      local_219 = local_219 & 1;
    }
    local_220 = create::Create::isLeftBumper();
    local_220 = local_220 & 1;
    local_21f = create::Create::isRightBumper();
    local_21f = local_21f & 1;
    poVar2 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)contact_bumpers);
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,light_bumpers._0_2_);
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,light_bumpers._2_2_);
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,light_bumpers._4_2_);
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,light_signals[0]);
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,light_signals[1]);
    poVar2 = std::operator<<(poVar2," ]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21e & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21d & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21c & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21b & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21a & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_219 & 1));
    poVar2 = std::operator<<(poVar2," ]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_220 & 1));
    poVar2 = std::operator<<(poVar2," , ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_21f & 1));
    poVar2 = std::operator<<(poVar2," ]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  uint16_t light_signals[6] = {0, 0, 0, 0, 0, 0};
  bool light_bumpers[6] = {false, false, false, false, false, false};
  bool contact_bumpers[2] = {false, false};

  while (true) {
    // Get light sensor data (only available for Create 2 or later robots)
    if (model == create::RobotModel::CREATE_2) {
      // Get raw light signal values
      light_signals[0] = robot.getLightSignalLeft();
      light_signals[1] = robot.getLightSignalFrontLeft();
      light_signals[2] = robot.getLightSignalCenterLeft();
      light_signals[3] = robot.getLightSignalCenterRight();
      light_signals[4] = robot.getLightSignalFrontRight();
      light_signals[5] = robot.getLightSignalRight();

      // Get obstacle data from light sensors (true/false)
      light_bumpers[0] = robot.isLightBumperLeft();
      light_bumpers[1] = robot.isLightBumperFrontLeft();
      light_bumpers[2] = robot.isLightBumperCenterLeft();
      light_bumpers[3] = robot.isLightBumperCenterRight();
      light_bumpers[4] = robot.isLightBumperFrontRight();
      light_bumpers[5] = robot.isLightBumperRight();
    }

    // Get state of bumpers
    contact_bumpers[0] = robot.isLeftBumper();
    contact_bumpers[1] = robot.isRightBumper();

    // Print signals from left to right
    std::cout << "[ " << light_signals[0] << " , "
                      << light_signals[1] << " , "
                      << light_signals[2] << " , "
                      << light_signals[3] << " , "
                      << light_signals[4] << " , "
                      << light_signals[5]
              << " ]" << std::endl;
    std::cout << "[ " << light_bumpers[0] << " , "
                      << light_bumpers[1] << " , "
                      << light_bumpers[2] << " , "
                      << light_bumpers[3] << " , "
                      << light_bumpers[4] << " , "
                      << light_bumpers[5]
              << " ]" << std::endl;
    std::cout << "[ " << contact_bumpers[0] << " , "
                      << contact_bumpers[1]
              << " ]" << std::endl;
    std::cout << std::endl;

    usleep(100000);  // 10 Hz
  }

  return 0;
}